

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined4 uVar8;
  undefined4 uVar12;
  float *pfVar9;
  int *piVar10;
  Allocator *pAVar11;
  int iVar13;
  bool bVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  Mat *pMVar18;
  Mat *A;
  ulong uVar19;
  int iVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  long lVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  Mat *pMVar28;
  ulong uVar29;
  long lVar30;
  int k;
  size_t sVar31;
  long lVar32;
  long lVar33;
  int kk;
  ulong uVar34;
  long lVar35;
  long lVar36;
  undefined1 *puVar37;
  char *pcVar38;
  void *pvVar39;
  void *pvVar40;
  int i;
  long lVar41;
  uint uVar42;
  ulong uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  ulong uVar47;
  long lVar48;
  uint uVar49;
  ulong uVar50;
  long lVar51;
  undefined1 auVar52 [16];
  float fVar53;
  int TILE_M;
  int TILE_K;
  int TILE_N;
  ulong local_1e8;
  ulong local_1d8;
  long local_1d0;
  uint local_1c4;
  ulong local_1c0;
  Mat *local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  undefined4 local_19c;
  Mat local_198;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  Mat *local_130;
  long local_128;
  ulong local_120;
  long local_118;
  ulong local_110;
  long local_108;
  int local_fc;
  Mat local_f8;
  Option *local_b0;
  long local_a8;
  undefined8 local_a0;
  uint local_94;
  int local_90;
  int local_8c;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  uVar8 = (this->super_Convolution).kernel_w;
  uVar12 = (this->super_Convolution).kernel_h;
  uVar49 = uVar12 * uVar8;
  uVar34 = (ulong)uVar49;
  uVar47 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar49;
  uVar42 = (this->super_Convolution).num_output;
  local_1b0 = (ulong)(int)uVar42;
  uVar43 = (ulong)uVar42;
  uVar47 = (long)((ulong)(uint)((int)uVar47 >> 0x1f) << 0x20 | uVar47 & 0xffffffff) /
           (long)(int)uVar42;
  uVar26 = (uint)uVar47;
  uVar25 = uVar47 & 0xffffffff;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar14 = false;
    uVar44 = uVar42;
  }
  else {
    bVar14 = 8 < (int)uVar42 || 8 < (int)uVar26;
    uVar44 = CONCAT31((int3)(uVar42 >> 8),8 < (int)uVar26);
  }
  auVar52._0_4_ = -(uint)(uVar8 == 3);
  auVar52._4_4_ = -(uint)(uVar12 == 3);
  auVar52._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
  auVar52._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
  iVar20 = movmskps(uVar44,auVar52);
  local_130 = &(this->super_Convolution).weight_data;
  local_148 = uVar25;
  local_b0 = opt;
  if ((((iVar20 == 0xf) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar14)))) {
    if (opt->use_winograd43_convolution == true) {
      get_optimal_tile_mnk_int8
                (uVar42,0,uVar26,(int *)&local_1c4,&local_fc,&local_19c,opt->num_threads);
      local_140 = (ulong)local_1c4;
      uVar47 = (long)(int)((uVar42 - 1) + local_1c4) / (long)(int)local_1c4;
      uVar43 = (ulong)local_19c;
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      Mat::create(&local_f8,local_19c * local_1c4 * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
      iVar20 = (int)uVar47;
      Mat::create(&this->weight_winograd43_data,local_19c * local_1c4,0x24,
                  (int)(local_19c + uVar26 + -1) / local_19c,iVar20,4,(Allocator *)0x0);
      if (0 < iVar20) {
        local_1c0 = (ulong)(int)uVar26;
        local_138 = uVar47 & 0xffffffff;
        local_1d8 = 0;
        local_1a8 = uVar43;
        do {
          iVar20 = get_omp_thread_num();
          if (0 < (int)uVar25) {
            iVar24 = (int)local_1d8 * (int)local_140;
            local_1b8 = (Mat *)((long)iVar20 * local_f8.cstep *
                                CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                               (long)local_f8.data);
            uVar49 = uVar42 - iVar24;
            uVar47 = (ulong)uVar49;
            if ((int)local_140 < (int)uVar49) {
              uVar47 = local_140 & 0xffffffff;
            }
            uVar50 = 0;
            uVar34 = uVar43;
            do {
              uVar43 = local_1a8;
              uVar49 = (int)uVar25 - (int)uVar50;
              if ((int)(uint)uVar34 < (int)uVar49) {
                uVar49 = (uint)uVar34;
              }
              if (0 < (int)uVar47) {
                pvVar39 = local_130->data;
                uVar25 = 0;
                pMVar18 = local_1b8;
                do {
                  if (0 < (int)uVar49) {
                    uVar34 = 0;
                    do {
                      pcVar38 = (char *)((long)pvVar39 +
                                        (uVar34 + uVar50) * 9 +
                                        (long)(int)((iVar24 + (int)uVar25) * uVar26 * 9));
                      lVar41 = 0;
                      do {
                        cVar2 = *pcVar38;
                        cVar3 = pcVar38[1];
                        cVar4 = pcVar38[2];
                        *(short *)((long)&local_198.data + lVar41 * 2) = cVar2 * 6;
                        *(short *)((long)&local_198.data + lVar41 * 2 + 6) =
                             -(cVar4 * 4 + cVar3 * 4 + cVar2 * 4);
                        *(short *)((long)&local_198.refcount + lVar41 * 2 + 4) =
                             cVar3 * 4 + cVar2 * -4 + cVar4 * -4;
                        *(short *)((long)&local_198.elemsize + lVar41 * 2 + 2) =
                             (short)cVar2 + cVar3 * 2 + cVar4 * 4;
                        *(short *)((long)&local_198.elempack + lVar41 * 2) =
                             ((short)cVar2 - ((short)cVar3 + (short)cVar3)) + cVar4 * 4;
                        *(short *)(&local_198.field_0x1e + lVar41 * 2) = cVar4 * 6;
                        pcVar38 = pcVar38 + 3;
                        lVar41 = lVar41 + 1;
                      } while (lVar41 != 3);
                      lVar41 = 4;
                      do {
                        sVar5 = *(short *)((long)&local_19c + lVar41);
                        sVar6 = *(short *)((long)&local_19c + lVar41 + 2);
                        sVar7 = *(short *)((long)&local_198.data + lVar41);
                        *(short *)&pMVar18->data = sVar5 * 6;
                        *(short *)((long)&pMVar18->data + 2) = -(sVar7 * 4 + sVar6 * 4 + sVar5 * 4);
                        *(short *)((long)&pMVar18->data + 4) = sVar6 * 4 + sVar5 * -4 + sVar7 * -4;
                        *(short *)((long)&pMVar18->data + 6) = sVar5 + sVar6 * 2 + sVar7 * 4;
                        *(short *)&pMVar18->refcount = sVar5 + sVar6 * -2 + sVar7 * 4;
                        *(short *)((long)&pMVar18->refcount + 2) = sVar7 * 6;
                        pMVar18 = (Mat *)((long)&pMVar18->refcount + 4);
                        lVar41 = lVar41 + 6;
                      } while (lVar41 != 0x28);
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar49);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar47);
              }
              local_198.w = (this->weight_winograd43_data).w;
              local_198.elemsize = (this->weight_winograd43_data).elemsize;
              local_198.h = (this->weight_winograd43_data).h;
              local_198.elempack = (this->weight_winograd43_data).elempack;
              local_198.allocator = (this->weight_winograd43_data).allocator;
              local_198.cstep = (long)local_198.h * (long)local_198.w;
              local_198.data =
                   (void *)((long)(this->weight_winograd43_data).data +
                           local_198.elemsize * local_198.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 |
                                             uVar50 & 0xffffffff) / (long)(int)local_1a8) +
                           (this->weight_winograd43_data).cstep * local_1d8 * local_198.elemsize);
              local_198.refcount = (int *)0x0;
              local_198.dims = 2;
              local_198.d = 1;
              local_198.c = 1;
              pack_A_tile_int8(local_1b8,&local_198,0x24,(int)uVar47,uVar49);
              uVar50 = uVar50 + uVar43;
              uVar34 = uVar43;
              uVar25 = local_148;
            } while ((long)uVar50 < (long)local_1c0);
          }
          local_1d8 = local_1d8 + 1;
        } while (local_1d8 != local_138);
      }
      piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar10 == (int *)0x0) goto LAB_00159752;
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 != 0) goto LAB_00159752;
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        goto LAB_00159752;
      }
    }
    else {
      get_optimal_tile_mnk_int8
                (uVar42,0,uVar26,(int *)&local_1c4,&local_fc,&local_19c,opt->num_threads);
      local_1c0 = (ulong)local_1c4;
      uVar47 = (long)(int)((uVar42 - 1) + local_1c4) / (long)(int)local_1c4;
      pMVar18 = (Mat *)(long)local_19c;
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize._0_4_ = 0;
      local_f8.elemsize._4_4_ = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      Mat::create(&local_f8,local_19c * local_1c4 * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
      iVar20 = (int)uVar47;
      Mat::create(&this->weight_winograd23_data,local_19c * local_1c4,0x10,
                  (int)(local_19c + uVar26 + -1) / local_19c,iVar20,2,(Allocator *)0x0);
      if (0 < iVar20) {
        local_1a8 = uVar47 & 0xffffffff;
        local_1e8 = 0;
        local_1b8 = pMVar18;
        do {
          iVar20 = get_omp_thread_num();
          if (0 < (int)uVar25) {
            iVar24 = (int)local_1e8 * (int)local_1c0;
            A = (Mat *)((long)iVar20 * local_f8.cstep *
                        CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                       (long)local_f8.data);
            uVar49 = uVar42 - iVar24;
            uVar47 = (ulong)uVar49;
            if ((int)local_1c0 < (int)uVar49) {
              uVar47 = local_1c0 & 0xffffffff;
            }
            uVar43 = 0;
            pMVar28 = pMVar18;
            do {
              pMVar18 = local_1b8;
              uVar49 = (int)uVar25 - (int)uVar43;
              uVar25 = (ulong)uVar49;
              if ((int)pMVar28 < (int)uVar49) {
                uVar25 = (ulong)pMVar28 & 0xffffffff;
              }
              if (0 < (int)uVar47) {
                pvVar39 = local_130->data;
                uVar34 = 0;
                pMVar28 = A;
                do {
                  if (0 < (int)uVar25) {
                    uVar50 = 0;
                    do {
                      pcVar38 = (char *)((long)pvVar39 +
                                        (uVar50 + uVar43) * 9 +
                                        (long)(int)((iVar24 + (int)uVar34) * uVar26 * 9));
                      lVar41 = 0;
                      do {
                        cVar2 = *pcVar38;
                        cVar3 = pcVar38[1];
                        cVar4 = pcVar38[2];
                        *(short *)((long)&local_198.data + lVar41 * 2) = cVar2 * 2;
                        *(short *)((long)&local_198.data + lVar41 * 2 + 6) =
                             (short)cVar3 + (short)cVar2 + (short)cVar4;
                        *(short *)((long)&local_198.refcount + lVar41 * 2 + 4) =
                             ((short)cVar2 - (short)cVar3) + (short)cVar4;
                        *(short *)((long)&local_198.elemsize + lVar41 * 2 + 2) =
                             (short)cVar4 + (short)cVar4;
                        pcVar38 = pcVar38 + 3;
                        lVar41 = lVar41 + 1;
                      } while (lVar41 != 3);
                      lVar41 = 4;
                      do {
                        sVar5 = *(short *)((long)&local_19c + lVar41);
                        sVar6 = *(short *)((long)&local_19c + lVar41 + 2);
                        sVar7 = *(short *)((long)&local_198.data + lVar41);
                        *(short *)&pMVar28->data = sVar5 * 2;
                        *(short *)((long)&pMVar28->data + 2) = sVar6 + sVar5 + sVar7;
                        *(short *)((long)&pMVar28->data + 4) = (sVar5 - sVar6) + sVar7;
                        *(short *)((long)&pMVar28->data + 6) = sVar7 * 2;
                        pMVar28 = (Mat *)&pMVar28->refcount;
                        lVar41 = lVar41 + 6;
                      } while (lVar41 != 0x1c);
                      uVar50 = uVar50 + 1;
                    } while (uVar50 != uVar25);
                  }
                  uVar34 = uVar34 + 1;
                } while (uVar34 != uVar47);
              }
              local_198.w = (this->weight_winograd23_data).w;
              local_198.elemsize = (this->weight_winograd23_data).elemsize;
              local_198.h = (this->weight_winograd23_data).h;
              local_198.elempack = (this->weight_winograd23_data).elempack;
              local_198.allocator = (this->weight_winograd23_data).allocator;
              local_198.cstep = (long)local_198.h * (long)local_198.w;
              local_198.data =
                   (void *)((long)(this->weight_winograd23_data).data +
                           local_198.elemsize * local_198.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 |
                                             uVar43 & 0xffffffff) / (long)(int)local_1b8) +
                           (this->weight_winograd23_data).cstep * local_1e8 * local_198.elemsize);
              local_198.refcount = (int *)0x0;
              local_198.dims = 2;
              local_198.d = 1;
              local_198.c = 1;
              pack_A_tile_int8(A,&local_198,0x10,(int)uVar47,(int)uVar25);
              uVar43 = (long)&pMVar18->data + uVar43;
              uVar25 = local_148;
              pMVar28 = pMVar18;
            } while ((long)uVar43 < (long)(int)uVar26);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 != local_1a8);
      }
      piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar10 == (int *)0x0) goto LAB_00159752;
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 != 0) goto LAB_00159752;
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        goto LAB_00159752;
      }
    }
  }
  else {
    local_1a8 = uVar34;
    if (opt->use_sgemm_convolution != true) {
      lVar41 = (long)(int)uVar49;
      uVar50 = uVar34;
      local_80 = lVar41;
      if ((int)uVar42 < 4) {
        if ((int)uVar42 < 2) {
          uVar44 = uVar42;
          if ((int)uVar26 < 8) {
            if (1 < (int)uVar26) {
              uVar26 = uVar26 - (int)(uVar25 >> 1);
              goto LAB_00158d4b;
            }
            sVar31 = 1;
            iVar20 = 1;
          }
          else {
            uVar26 = (uVar26 & 1) + (int)(uVar25 >> 3) + ((uint)(uVar25 >> 1) & 3);
            sVar31 = 8;
            iVar20 = 8;
          }
        }
        else if ((int)uVar26 < 8) {
          if ((int)uVar26 < 2) {
            uVar44 = (uVar42 & 1) + 1;
LAB_00158d4b:
            sVar31 = 2;
            iVar20 = 2;
          }
          else {
            uVar26 = uVar26 - (int)(uVar25 >> 1);
            sVar31 = 4;
            iVar20 = 4;
            uVar44 = (uVar42 & 1) + 1;
          }
        }
        else {
          uVar26 = (uVar26 & 1) + (int)(uVar25 >> 3) + ((uint)(uVar25 >> 1) & 3);
          sVar31 = 0x10;
          iVar20 = 0x10;
          uVar44 = (uVar42 & 1) + 1;
        }
        Mat::create(&this->weight_data_tm,uVar49,uVar26,uVar44,sVar31,iVar20,(Allocator *)0x0);
        uVar29 = 0;
      }
      else {
        if ((int)uVar26 < 8) {
          if ((int)uVar26 < 2) {
            iVar20 = (uVar42 & 1) + ((uint)(local_1b0 >> 2) & 0x3fffffff) +
                     (uint)((uVar42 >> 1 & 1) != 0);
            sVar31 = 4;
            iVar24 = 4;
            uVar44 = uVar26;
          }
          else {
            iVar20 = (uVar42 & 1) + (uVar42 >> 2) + (uint)((uVar42 >> 1 & 1) != 0);
            sVar31 = 8;
            iVar24 = 8;
            uVar44 = uVar26 - (int)(uVar25 >> 1);
          }
        }
        else {
          iVar20 = (uVar42 & 1) + (uVar42 >> 2) + (uint)((uVar42 >> 1 & 1) != 0);
          sVar31 = 0x20;
          iVar24 = 0x20;
          uVar44 = (uVar26 & 1) + (int)(uVar25 >> 3) + ((uint)(uVar25 >> 1) & 3);
        }
        Mat::create(&this->weight_data_tm,uVar49,uVar44,iVar20,sVar31,iVar24,(Allocator *)0x0);
        iVar45 = uVar26 * uVar49;
        lVar30 = (long)(int)(uVar49 * 2);
        local_138 = (ulong)(int)(uVar49 * 8);
        local_a0 = CONCAT44(local_a0._4_4_,uVar26) & 0xfffffffffffffff8;
        iVar15 = uVar26 * uVar49;
        iVar20 = iVar15 * 4;
        local_a8 = CONCAT44(local_a8._4_4_,iVar20);
        iVar24 = iVar15 * 3;
        iVar15 = iVar15 * 2;
        local_128 = CONCAT44(local_128._4_4_,iVar45);
        uVar29 = 0;
        uVar19 = 0;
        iVar17 = iVar45;
        do {
          local_110 = uVar19;
          local_120 = uVar29;
          pvVar39 = (this->super_Convolution).weight_data.data;
          uVar26 = (uint)local_120;
          local_1c0 = (long)(int)(iVar45 * uVar26) + (long)pvVar39;
          local_1d0 = (long)(int)((uVar26 | 1) * iVar45) + (long)pvVar39;
          local_1e8 = (long)(int)((uVar26 | 2) * iVar45) + (long)pvVar39;
          lVar35 = (long)(int)((uVar26 | 3) * iVar45) + (long)pvVar39;
          puVar21 = (undefined1 *)
                    ((local_120 >> 2) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          local_140 = CONCAT44(local_140._4_4_,iVar24);
          local_108 = CONCAT44(local_108._4_4_,iVar15);
          local_118 = CONCAT44(local_118._4_4_,iVar17);
          iVar46 = (int)local_110;
          if ((int)uVar25 < 8) {
            pMVar18 = (Mat *)0x0;
          }
          else {
            lVar33 = 0;
            pMVar18 = (Mat *)0x0;
            do {
              local_1b8 = pMVar18;
              if (0 < (int)uVar50) {
                uVar25 = 0;
                lVar32 = lVar33;
                do {
                  puVar22 = puVar21;
                  lVar36 = 0;
                  lVar23 = lVar32;
                  do {
                    puVar22[lVar36] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar46);
                    puVar22[lVar36 + 1] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar46 + lVar41);
                    puVar22[lVar36 + 2] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar17);
                    puVar22[lVar36 + 3] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar17 + lVar41);
                    puVar22[lVar36 + 4] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar15);
                    puVar22[lVar36 + 5] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar15 + lVar41);
                    puVar22[lVar36 + 6] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar24);
                    puVar22[lVar36 + 7] = *(undefined1 *)((long)pvVar39 + lVar23 + iVar24 + lVar41);
                    lVar36 = lVar36 + 8;
                    lVar23 = lVar23 + lVar30;
                  } while ((int)lVar36 != 0x20);
                  uVar25 = uVar25 + 1;
                  lVar32 = lVar32 + 1;
                  puVar21 = puVar22 + lVar36;
                } while (uVar25 != uVar34);
                puVar21 = puVar22 + lVar36;
              }
              local_1c0 = local_1c0 + local_138;
              local_1d0 = local_1d0 + local_138;
              local_1e8 = local_1e8 + local_138;
              lVar35 = lVar35 + local_138;
              lVar33 = lVar33 + local_138;
              pMVar18 = (Mat *)(ulong)((int)local_1b8 + 8);
              uVar50 = local_1a8;
            } while ((int)local_1b8 + 0xf < (int)local_148);
            pMVar18 = (Mat *)(uVar47 & 0xfffffff8);
            lVar41 = local_80;
            uVar25 = local_148;
          }
          uVar26 = (uint)pMVar18;
          uVar29 = local_1c0;
          if ((int)(uVar26 | 1) < (int)uVar25) {
            lVar33 = lVar35 + lVar41;
            lVar36 = local_1e8 + lVar41;
            lVar32 = local_1d0 + lVar41;
            lVar23 = local_1c0 + lVar41;
            do {
              if (0 < (int)uVar50) {
                uVar25 = 0;
                puVar22 = puVar21;
                do {
                  puVar37 = puVar22;
                  puVar22 = puVar21 + uVar25 * 8;
                  *puVar22 = *(undefined1 *)(uVar29 + uVar25);
                  puVar22[1] = *(undefined1 *)(lVar23 + uVar25);
                  puVar22[2] = *(undefined1 *)(local_1d0 + uVar25);
                  puVar22[3] = *(undefined1 *)(lVar32 + uVar25);
                  puVar22[4] = *(undefined1 *)(local_1e8 + uVar25);
                  puVar22[5] = *(undefined1 *)(lVar36 + uVar25);
                  puVar22[6] = *(undefined1 *)(lVar35 + uVar25);
                  puVar22[7] = *(undefined1 *)(lVar33 + uVar25);
                  uVar25 = uVar25 + 1;
                  puVar22 = puVar22 + 8;
                } while (uVar34 != uVar25);
                puVar21 = puVar37 + 8;
                uVar25 = local_148;
                uVar50 = local_1a8;
                local_1b8 = pMVar18;
              }
              uVar29 = uVar29 + lVar30;
              local_1d0 = local_1d0 + lVar30;
              local_1e8 = local_1e8 + lVar30;
              lVar35 = lVar35 + lVar30;
              iVar13 = (int)pMVar18;
              uVar26 = iVar13 + 2;
              lVar33 = lVar33 + lVar30;
              lVar36 = lVar36 + lVar30;
              lVar32 = lVar32 + lVar30;
              lVar23 = lVar23 + lVar30;
              pMVar18 = (Mat *)(ulong)uVar26;
            } while (iVar13 + 3 < (int)uVar25);
          }
          if ((int)uVar26 < (int)(uint)uVar25) {
            do {
              if (0 < (int)uVar50) {
                uVar19 = 0;
                do {
                  *puVar21 = *(undefined1 *)(uVar29 + uVar19);
                  puVar21[1] = *(undefined1 *)(local_1d0 + uVar19);
                  puVar21[2] = *(undefined1 *)(local_1e8 + uVar19);
                  puVar21[3] = *(undefined1 *)(lVar35 + uVar19);
                  puVar21 = puVar21 + 4;
                  uVar19 = uVar19 + 1;
                } while (uVar34 != uVar19);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != (uint)uVar25);
          }
          uVar29 = local_120 + 4;
          iVar17 = iVar17 + iVar20;
          iVar15 = iVar15 + iVar20;
          iVar24 = iVar24 + iVar20;
          uVar19 = (ulong)(uint)(iVar46 + iVar20);
        } while (local_120 + 7 < uVar43);
      }
      uVar44 = (uint)uVar25;
      iVar20 = (int)uVar50;
      uVar49 = (uint)uVar29;
      uVar26 = uVar49 | 1;
      if ((int)uVar26 < (int)uVar42) {
        uVar27 = uVar44 * iVar20;
        local_50 = (ulong)uVar27;
        local_88 = (long)(iVar20 * 2);
        local_58 = (long)(iVar20 * 3);
        local_60 = (long)(iVar20 * 4);
        local_68 = (long)(iVar20 * 5);
        local_70 = (long)(iVar20 * 6);
        local_38 = (long)(iVar20 * 8);
        local_78 = (long)(iVar20 * 7);
        local_94 = uVar44 & 0xfffffff8;
        local_90 = uVar27 * 2;
        uVar49 = uVar49 * uVar27;
        uVar47 = uVar29 & 0xffffffff;
        iVar24 = uVar27 * uVar26;
        do {
          local_8c = iVar24;
          local_40 = uVar47;
          pvVar39 = (this->super_Convolution).weight_data.data;
          uVar47 = (long)(int)(uVar27 * (uint)local_40) + (long)pvVar39;
          lVar30 = (long)(int)(uVar26 * uVar27) + (long)pvVar39;
          puVar21 = (undefined1 *)
                    ((ulong)(((uint)(local_40 >> 2) & 0x3fffffff) +
                            (uint)(((uint)local_40 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          if ((int)uVar25 < 8) {
            uVar26 = 0;
          }
          else {
            lVar32 = (long)local_8c;
            lVar51 = (long)(int)uVar49;
            local_140 = (long)pvVar39 + lVar32 + local_78;
            lVar35 = (long)pvVar39 + lVar32 + local_70;
            lVar33 = (long)pvVar39 + lVar32 + local_68;
            local_108 = (long)pvVar39 + lVar32 + local_60;
            local_110 = (long)pvVar39 + lVar32 + local_58;
            local_120 = (long)pvVar39 + lVar32 + local_88;
            local_128 = (long)pvVar39 + lVar32 + lVar41;
            local_138 = (long)pvVar39 + lVar51 + local_78;
            lVar48 = (long)pvVar39 + lVar51 + local_70;
            lVar32 = (long)pvVar39 + lVar51 + local_60;
            lVar23 = (long)pvVar39 + lVar51 + local_58;
            local_118 = (long)pvVar39 + lVar51 + local_88;
            lVar36 = (long)pvVar39 + lVar51 + lVar41;
            uVar29 = 0;
            pMVar18 = (Mat *)((long)pvVar39 + lVar51 + local_68);
            local_1c0 = uVar47;
            do {
              local_a8 = lVar30;
              local_1b8 = pMVar18;
              local_a0 = uVar29;
              if (0 < (int)uVar50) {
                uVar47 = 0;
                do {
                  *puVar21 = *(undefined1 *)(local_1c0 + uVar47);
                  puVar21[1] = *(undefined1 *)(lVar36 + uVar47);
                  puVar21[2] = *(undefined1 *)(local_118 + uVar47);
                  puVar21[3] = *(undefined1 *)(lVar23 + uVar47);
                  puVar21[4] = *(undefined1 *)(lVar32 + uVar47);
                  puVar21[5] = *(undefined1 *)((long)&local_1b8->data + uVar47);
                  puVar21[6] = *(undefined1 *)(lVar48 + uVar47);
                  puVar21[7] = *(undefined1 *)(local_138 + uVar47);
                  puVar21[8] = *(undefined1 *)(local_a8 + uVar47);
                  puVar21[9] = *(undefined1 *)(local_128 + uVar47);
                  puVar21[10] = *(undefined1 *)(local_120 + uVar47);
                  puVar21[0xb] = *(undefined1 *)(local_110 + uVar47);
                  puVar21[0xc] = *(undefined1 *)(local_108 + uVar47);
                  puVar21[0xd] = *(undefined1 *)(lVar33 + uVar47);
                  puVar21[0xe] = *(undefined1 *)(lVar35 + uVar47);
                  puVar21[0xf] = *(undefined1 *)(local_140 + uVar47);
                  puVar21 = puVar21 + 0x10;
                  uVar47 = uVar47 + 1;
                } while (uVar34 != uVar47);
              }
              uVar47 = local_1c0 + local_38;
              lVar30 = local_a8 + local_38;
              local_140 = local_140 + local_38;
              lVar35 = lVar35 + local_38;
              lVar33 = lVar33 + local_38;
              local_108 = local_108 + local_38;
              local_110 = local_110 + local_38;
              local_120 = local_120 + local_38;
              local_128 = local_128 + local_38;
              local_138 = local_138 + local_38;
              lVar48 = lVar48 + local_38;
              lVar32 = lVar32 + local_38;
              lVar23 = lVar23 + local_38;
              local_118 = local_118 + local_38;
              lVar36 = lVar36 + local_38;
              uVar50 = local_1a8;
              uVar29 = (ulong)((int)local_a0 + 8);
              pMVar18 = (Mat *)((long)&local_1b8->data + local_38);
              lVar41 = local_80;
              uVar25 = local_148;
              local_1c0 = uVar47;
              local_48 = (ulong)uVar49;
              uVar26 = local_94;
            } while ((int)local_a0 + 0xf < (int)local_148);
          }
          uVar44 = (uint)uVar25;
          iVar20 = (int)uVar50;
          if ((int)(uVar26 | 1) < (int)uVar44) {
            lVar35 = lVar30 + lVar41;
            lVar33 = uVar47 + lVar41;
            uVar16 = uVar26;
            do {
              if (0 < iVar20) {
                uVar29 = 0;
                do {
                  *puVar21 = *(undefined1 *)(uVar47 + uVar29);
                  puVar21[1] = *(undefined1 *)(lVar30 + uVar29);
                  puVar21[2] = *(undefined1 *)(lVar33 + uVar29);
                  puVar21[3] = *(undefined1 *)(lVar35 + uVar29);
                  puVar21 = puVar21 + 4;
                  uVar29 = uVar29 + 1;
                } while (uVar34 != uVar29);
              }
              uVar47 = uVar47 + local_88;
              lVar30 = lVar30 + local_88;
              uVar26 = uVar16 + 2;
              iVar24 = uVar16 + 3;
              lVar35 = lVar35 + local_88;
              lVar33 = lVar33 + local_88;
              uVar16 = uVar26;
            } while (iVar24 < (int)uVar44);
          }
          if ((int)uVar26 < (int)uVar44) {
            do {
              if (0 < iVar20) {
                uVar29 = 0;
                do {
                  *puVar21 = *(undefined1 *)(uVar47 + uVar29);
                  puVar21[1] = *(undefined1 *)(lVar30 + uVar29);
                  puVar21 = puVar21 + 2;
                  uVar29 = uVar29 + 1;
                } while (uVar34 != uVar29);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar44);
          }
          uVar26 = (uint)(local_40 + 3);
          uVar49 = uVar49 + local_90;
          uVar47 = local_40 + 2;
          iVar24 = local_8c + local_90;
        } while ((long)(local_40 + 3) < (long)local_1b0);
        uVar49 = (uint)(local_40 + 2);
      }
      if ((int)uVar49 < (int)uVar42) {
        uVar47 = (ulong)uVar49;
        do {
          uVar42 = (uint)uVar47;
          lVar30 = (long)(int)(uVar44 * iVar20 * uVar42) +
                   (long)(this->super_Convolution).weight_data.data;
          puVar21 = (undefined1 *)
                    ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                     (ulong)((uVar42 & 1) + ((uint)(uVar47 >> 2) & 0x3fffffff) +
                            (uint)((uVar42 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
          uVar42 = 0;
          uVar26 = 0;
          if (7 < (int)uVar44) {
            do {
              if (0 < iVar20) {
                uVar25 = 0;
                do {
                  puVar22 = puVar21;
                  puVar21 = (undefined1 *)(lVar30 + uVar25);
                  lVar35 = 0;
                  do {
                    puVar22[lVar35] = *puVar21;
                    puVar21 = puVar21 + lVar41;
                    lVar35 = lVar35 + 1;
                  } while ((int)lVar35 != 8);
                  uVar25 = uVar25 + 1;
                  puVar21 = puVar22 + lVar35;
                } while (uVar25 != uVar34);
                puVar21 = puVar22 + lVar35;
              }
              lVar30 = lVar30 + iVar20 * 8;
              iVar24 = uVar42 + 0xf;
              uVar42 = uVar42 + 8;
              uVar26 = uVar44 & 0xfffffff8;
            } while (iVar24 < (int)uVar44);
          }
          if ((int)(uVar26 | 1) < (int)uVar44) {
            lVar35 = lVar30 + lVar41;
            uVar42 = uVar26;
            do {
              if (0 < iVar20) {
                uVar25 = 0;
                do {
                  *puVar21 = *(undefined1 *)(lVar30 + uVar25);
                  puVar21[1] = *(undefined1 *)(lVar35 + uVar25);
                  puVar21 = puVar21 + 2;
                  uVar25 = uVar25 + 1;
                } while (uVar34 != uVar25);
              }
              lVar30 = lVar30 + iVar20 * 2;
              uVar26 = uVar42 + 2;
              iVar24 = uVar42 + 3;
              lVar35 = lVar35 + iVar20 * 2;
              uVar42 = uVar26;
            } while (iVar24 < (int)uVar44);
          }
          if ((int)uVar26 < (int)uVar44) {
            do {
              if (0 < iVar20) {
                uVar25 = 0;
                do {
                  puVar21[uVar25] = *(undefined1 *)(lVar30 + uVar25);
                  uVar25 = uVar25 + 1;
                } while (uVar34 != uVar25);
                puVar21 = puVar21 + uVar25;
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar44);
          }
          uVar47 = uVar47 + 1;
        } while (uVar47 != uVar43);
      }
      goto LAB_00159752;
    }
    iVar24 = uVar26 * uVar49;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar42,0,iVar24,(int *)&local_1c4,&local_fc,&local_19c,opt->num_threads);
    uVar25 = local_1a8;
    iVar20 = (int)(local_1c4 + uVar42 + -1) / (int)local_1c4;
    uVar49 = 8;
    if (opt->use_packing_layout == false) {
      uVar49 = 1;
    }
    if ((uVar47 & 7) != 0) {
      uVar49 = 1;
    }
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize._0_4_ = 0;
    local_f8.elemsize._4_4_ = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    if ((int)local_1a8 == 1) {
      Mat::reshape(&local_198,local_130,iVar24,uVar42,(Allocator *)0x0);
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + 1;
        UNLOCK();
      }
      piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            if (local_f8.data != (void *)0x0) {
              free(local_f8.data);
            }
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_f8.data = local_198.data;
      local_f8.refcount._0_4_ = SUB84(local_198.refcount,0);
      local_f8.refcount._4_4_ = (undefined4)((ulong)local_198.refcount >> 0x20);
      local_f8.elemsize._0_4_ = (undefined4)local_198.elemsize;
      local_f8.elemsize._4_4_ = (undefined4)(local_198.elemsize >> 0x20);
      local_f8.elempack = local_198.elempack;
      local_f8.allocator = local_198.allocator;
      local_f8.dims = local_198.dims;
      local_f8.w = local_198.w;
      local_f8.h = local_198.h;
      local_f8.d = local_198.d;
      local_f8.c = local_198.c;
      local_f8.cstep = local_198.cstep;
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + -1;
        UNLOCK();
        if (*local_198.refcount == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
LAB_001594aa:
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::reshape(&local_198,local_130,(int)local_1a8,uVar26,uVar42,(Allocator *)0x0);
      Mat::create(&local_f8,iVar24,uVar42,1,1,(Allocator *)0x0);
      if (0 < (int)uVar42) {
        uVar47 = uVar25 & 0xffffffff;
        uVar34 = 0;
        do {
          if ((int)uVar49 <= (int)uVar26) {
            pvVar39 = (void *)((long)local_f8.w * uVar34 *
                               CONCAT44(local_f8.elemsize._4_4_,(undefined4)local_f8.elemsize) +
                              (long)local_f8.data);
            lVar41 = 0;
            do {
              if (0 < (int)uVar25) {
                uVar25 = 0;
                do {
                  pvVar40 = pvVar39;
                  uVar50 = 0;
                  do {
                    *(undefined1 *)((long)pvVar40 + uVar50) =
                         *(undefined1 *)
                          ((long)local_198.data +
                          uVar25 + (lVar41 + uVar50) * (long)local_198.w * local_198.elemsize +
                                   local_198.cstep * uVar34 * local_198.elemsize);
                    uVar50 = uVar50 + 1;
                  } while (uVar49 != uVar50);
                  uVar25 = uVar25 + 1;
                  pvVar39 = (void *)((long)pvVar40 + uVar50);
                } while (uVar25 != uVar47);
                pvVar39 = (void *)((long)pvVar40 + uVar50);
                uVar25 = local_1a8;
              }
              lVar41 = lVar41 + (ulong)uVar49;
            } while (lVar41 < (long)((long)(int)uVar26 - (ulong)(uVar49 - 1)));
          }
          uVar34 = uVar34 + 1;
        } while (uVar34 != uVar43);
      }
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + -1;
        UNLOCK();
        if (*local_198.refcount == 0) {
          if (local_198.allocator == (Allocator *)0x0) goto LAB_001594aa;
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar15 = local_19c;
    if (local_19c < 4) {
LAB_00159570:
      Mat::create(&this->weight_sgemm_data,local_1c4 * iVar15,(iVar15 + iVar24 + -1) / iVar15,
                  (int)((uVar42 - 1) + local_1c4) / (int)local_1c4,1,1,(Allocator *)0x0);
    }
    else {
      iVar17 = cpu_support_x86_avx512_vnni();
      bVar14 = true;
      if (iVar17 == 0) {
        iVar17 = cpu_support_x86_avx_vnni();
        bVar14 = iVar17 != 0;
      }
      iVar17 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar14 & iVar17 == 0)) goto LAB_00159570;
      iVar17 = 0x40;
      if ((((int)local_1c4 < 0x10) && (iVar17 = 0x20, (int)local_1c4 < 8)) &&
         (iVar17 = 0x10, (int)local_1c4 < 4)) {
        iVar17 = (uint)(1 < (int)local_1c4) * 4 + 4;
      }
      Mat::create(&this->weight_sgemm_data,(iVar17 + iVar15) * local_1c4,
                  (iVar15 + iVar24 + -1) / iVar15,(int)((uVar42 - 1) + local_1c4) / (int)local_1c4,1
                  ,1,(Allocator *)0x0);
    }
    if (0 < iVar20) {
      iVar17 = 0;
      do {
        iVar45 = local_1c4 * iVar17;
        uVar42 = (int)local_1b0 - iVar45;
        if ((int)local_1c4 < (int)uVar42) {
          uVar42 = local_1c4;
        }
        if (0 < iVar24) {
          iVar46 = 0;
          do {
            iVar13 = iVar24 - iVar46;
            if (iVar15 < iVar24 - iVar46) {
              iVar13 = iVar15;
            }
            local_198.w = (this->weight_sgemm_data).w;
            local_198.cstep = (size_t)local_198.w;
            local_198.elemsize = (this->weight_sgemm_data).elemsize;
            local_198.elempack = (this->weight_sgemm_data).elempack;
            local_198.allocator = (this->weight_sgemm_data).allocator;
            local_198.data =
                 (void *)((long)(this->weight_sgemm_data).data +
                         local_198.elemsize * local_198.cstep * (long)(iVar46 / iVar15) +
                         (long)(iVar45 / (int)local_1c4) * (this->weight_sgemm_data).cstep *
                         local_198.elemsize);
            local_198.refcount = (int *)0x0;
            local_198.dims = 2;
            local_198.h = 1;
            local_198.d = 1;
            local_198.c = 1;
            Gemm_x86_utility::pack_A_tile_int8(&local_f8,&local_198,iVar45,uVar42,iVar46,iVar13);
            if (local_198.refcount != (int *)0x0) {
              LOCK();
              *local_198.refcount = *local_198.refcount + -1;
              UNLOCK();
              if (*local_198.refcount == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  if (local_198.data != (void *)0x0) {
                    free(local_198.data);
                  }
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar46 = iVar46 + local_19c;
            iVar15 = local_19c;
          } while (iVar46 < iVar24);
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 != iVar20);
    }
    piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar10 == (int *)0x0) goto LAB_00159752;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_00159752;
    if (local_f8.allocator != (Allocator *)0x0) {
      (*(local_f8.allocator)->_vptr_Allocator[3])();
      goto LAB_00159752;
    }
  }
  if (local_f8.data != (void *)0x0) {
    free(local_f8.data);
  }
LAB_00159752:
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  lVar41 = (long)(this->super_Convolution).num_output;
  if (0 < lVar41) {
    pvVar39 = (this->super_Convolution).weight_data_int8_scales.data;
    pfVar9 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
    pvVar40 = (this->scale_in_data).data;
    lVar30 = 0;
    do {
      fVar1 = *(float *)((long)pvVar39 + lVar30 * 4);
      fVar53 = 0.0;
      if (fVar1 != 0.0) {
        fVar53 = 1.0 / (fVar1 * *pfVar9);
      }
      *(float *)((long)pvVar40 + lVar30 * 4) = fVar53;
      lVar30 = lVar30 + 1;
    } while (lVar41 != lVar30);
  }
  if (local_b0->lightmode != false) {
    piVar10 = (this->super_Convolution).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar39 = (this->super_Convolution).weight_data.data;
        pAVar11 = (this->super_Convolution).weight_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          if (pvVar39 != (void *)0x0) {
            free(pvVar39);
          }
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_130->refcount + 4) = 0;
    *(undefined8 *)((long)&local_130->elemsize + 4) = 0;
    local_130->data = (void *)0x0;
    local_130->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}